

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_names.c
# Opt level: O1

int dwarf_get_INL_name(uint val,char **s_out)

{
  int iVar1;
  
  iVar1 = -1;
  if (val < 4) {
    *s_out = &DAT_001f5114 + *(int *)(&DAT_001f5114 + (ulong)val * 4);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
dwarf_get_INL_name (unsigned int val,
    const char ** s_out)
{
    switch (val) {
    case DW_INL_not_inlined:
        *s_out = "DW_INL_not_inlined";
        return DW_DLV_OK;
    case DW_INL_inlined:
        *s_out = "DW_INL_inlined";
        return DW_DLV_OK;
    case DW_INL_declared_not_inlined:
        *s_out = "DW_INL_declared_not_inlined";
        return DW_DLV_OK;
    case DW_INL_declared_inlined:
        *s_out = "DW_INL_declared_inlined";
        return DW_DLV_OK;
    default: break;
    }
    return DW_DLV_NO_ENTRY;
}